

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall ethash_check_difficulty_check::test_method(ethash_check_difficulty_check *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_2e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_2d0;
  assertion_result local_2b0;
  basic_cstring<const_char> local_298;
  basic_cstring<const_char> local_288;
  basic_cstring<const_char> local_278;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_268;
  assertion_result local_248;
  basic_cstring<const_char> local_230;
  basic_cstring<const_char> local_220;
  basic_cstring<const_char> local_210;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_200;
  assertion_result local_1e0;
  basic_cstring<const_char> local_1c8;
  basic_cstring<const_char> local_1b8;
  basic_cstring<const_char> local_1a8;
  allocator local_191;
  string local_190 [32];
  char *local_170;
  allocator local_161;
  string local_160 [32];
  char *local_140 [3];
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]> local_128;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_const_char_*,_const_char_*const_&>
  local_108;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_const_char_*,_const_char_*const_&>,_char[45],_const_char_(&)[45]>
  local_e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_const_char_*,_const_char_*const_&>,_char[45],_const_char_(&)[45]>,_const_char_*,_const_char_*const_&>
  local_c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_const_char_*,_const_char_*const_&>,_char[45],_const_char_(&)[45]>,_const_char_*,_const_char_*const_&>,_char[3],_const_char_(&)[3]>
  local_a8;
  assertion_result local_88;
  basic_cstring<const_char> local_70;
  basic_cstring<const_char> local_60;
  undefined1 local_50 [8];
  ethash_h256_t target;
  ethash_h256_t hash;
  ethash_check_difficulty_check *this_local;
  
  builtin_memcpy(target.b + 0x18,"11111111",8);
  local_50[0] = '2';
  local_50[1] = '2';
  local_50[2] = '2';
  local_50[3] = '2';
  local_50[4] = '2';
  local_50[5] = '2';
  local_50[6] = '2';
  local_50[7] = '2';
  builtin_memcpy(target.b,"222222222222222222222222",0x18);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_70);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_60,0xbd,&local_70);
    bVar2 = ethash_check_difficulty((ethash_h256_t *)(target.b + 0x18),(ethash_h256_t *)local_50);
    boost::test_tools::assertion_result::assertion_result(&local_88,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_128,plVar3,(char (*) [12])"\nexpected \"");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,(char *)(target.b + 0x18),0x20,&local_161);
    local_140[0] = (char *)std::__cxx11::string::c_str();
    boost::unit_test::operator<<(&local_108,&local_128,local_140);
    boost::unit_test::operator<<
              (&local_e8,&local_108,(char (*) [45])"\" to have the same or less difficulty than \"")
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_190,local_50,0x20,&local_191);
    local_170 = (char *)std::__cxx11::string::c_str();
    boost::unit_test::operator<<(&local_c8,&local_e8,&local_170);
    boost::unit_test::operator<<(&local_a8,&local_c8,(char (*) [3])"\"\n");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::test_tools::tt_detail::report_assertion(&local_88,&local_a8,&local_1a8,0xbd,2,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_const_char_*,_const_char_*const_&>,_char[45],_const_char_(&)[45]>,_const_char_*,_const_char_*const_&>,_char[3],_const_char_(&)[3]>
    ::~lazy_ostream_impl(&local_a8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_const_char_*,_const_char_*const_&>,_char[45],_const_char_(&)[45]>,_const_char_*,_const_char_*const_&>
    ::~lazy_ostream_impl(&local_c8);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_const_char_*,_const_char_*const_&>,_char[45],_const_char_(&)[45]>
    ::~lazy_ostream_impl(&local_e8);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_const_char_*,_const_char_*const_&>
    ::~lazy_ostream_impl(&local_108);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>::
    ~lazy_ostream_impl(&local_128);
    boost::test_tools::assertion_result::~assertion_result(&local_88);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1b8,0xbf,&local_1c8);
    bVar2 = ethash_check_difficulty
                      ((ethash_h256_t *)(target.b + 0x18),(ethash_h256_t *)(target.b + 0x18));
    boost::test_tools::assertion_result::assertion_result(&local_1e0,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_200,plVar3,(char (*) [1])0x15b3a9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::test_tools::tt_detail::report_assertion(&local_1e0,&local_200,&local_210,0xbf,2,1,0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_200);
    boost::test_tools::assertion_result::~assertion_result(&local_1e0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_50[0] = '1';
  local_50[1] = '1';
  local_50[2] = '1';
  local_50[3] = '1';
  local_50[4] = '1';
  local_50[5] = '1';
  local_50[6] = '1';
  local_50[7] = '1';
  builtin_memcpy(target.b,"111111111111111111111112",0x18);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_230);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_220,0xc3,&local_230);
    bVar2 = ethash_check_difficulty((ethash_h256_t *)(target.b + 0x18),(ethash_h256_t *)local_50);
    boost::test_tools::assertion_result::assertion_result(&local_248,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_268,plVar3,(char (*) [1])0x15b3a9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::test_tools::tt_detail::report_assertion(&local_248,&local_268,&local_278,0xc3,2,1,0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_268);
    boost::test_tools::assertion_result::~assertion_result(&local_248);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_50[0] = '1';
  local_50[1] = '1';
  local_50[2] = '1';
  local_50[3] = '1';
  local_50[4] = '1';
  local_50[5] = '1';
  local_50[6] = '1';
  local_50[7] = '1';
  builtin_memcpy(target.b,"111111111111111111111110",0x18);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_298);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_288,199,&local_298);
    bVar2 = ethash_check_difficulty((ethash_h256_t *)(target.b + 0x18),(ethash_h256_t *)local_50);
    boost::test_tools::assertion_result::assertion_result(&local_2b0,!bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_2d0,plVar3,(char (*) [1])0x15b3a9);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2e0,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::test_tools::tt_detail::report_assertion(&local_2b0,&local_2d0,&local_2e0,199,2,1,0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_2d0);
    boost::test_tools::assertion_result::~assertion_result(&local_2b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(ethash_check_difficulty_check) {
	ethash_h256_t hash;
	ethash_h256_t target;
	memcpy(&hash, "11111111111111111111111111111111", 32);
	memcpy(&target, "22222222222222222222222222222222", 32);
	BOOST_REQUIRE_MESSAGE(
			ethash_check_difficulty(&hash, &target),
			"\nexpected \"" << std::string((char *) &hash, 32).c_str() << "\" to have the same or less difficulty than \"" << std::string((char *) &target, 32).c_str() << "\"\n");
	BOOST_REQUIRE_MESSAGE(
		ethash_check_difficulty(&hash, &hash), "");
			// "\nexpected \"" << hash << "\" to have the same or less difficulty than \"" << hash << "\"\n");
	memcpy(&target, "11111111111111111111111111111112", 32);
	BOOST_REQUIRE_MESSAGE(
		ethash_check_difficulty(&hash, &target), "");
			// "\nexpected \"" << hash << "\" to have the same or less difficulty than \"" << target << "\"\n");
	memcpy(&target, "11111111111111111111111111111110", 32);
	BOOST_REQUIRE_MESSAGE(
			!ethash_check_difficulty(&hash, &target), "");
			// "\nexpected \"" << hash << "\" to have more difficulty than \"" << target << "\"\n");
}